

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::FileExists(string *filename,bool isFile)

{
  bool bVar1;
  
  bVar1 = FileExists(filename);
  if (isFile && bVar1) {
    bVar1 = FileIsDirectory(filename);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool SystemTools::FileExists(const std::string& filename, bool isFile)
{
  if(SystemTools::FileExists(filename))
    {
    // If isFile is set return not FileIsDirectory,
    // so this will only be true if it is a file
    return !isFile || !SystemTools::FileIsDirectory(filename);
    }
  return false;
}